

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak_internal.hpp
# Opt level: O0

bool adiak::internal::create_container_type<std::vector<int,_std::allocator<int>_>_>::make_value
               (vector<int,_std::allocator<int>_> *c,adiak_value_t *value,adiak_datatype_t *dtype)

{
  bool bVar1;
  size_type sVar2;
  void *p;
  reference obj;
  long lVar3;
  iterator iStack_48;
  bool result;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_40;
  iterator i;
  int j;
  adiak_value_t *valarray;
  adiak_datatype_t *dtype_local;
  adiak_value_t *value_local;
  vector<int,_std::allocator<int>_> *c_local;
  
  sVar2 = std::vector<int,_std::allocator<int>_>::size(c);
  p = malloc(sVar2 << 3);
  i._M_current._4_4_ = 0;
  local_40._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(c);
  while( true ) {
    iStack_48 = std::vector<int,_std::allocator<int>_>::end(c);
    bVar1 = __gnu_cxx::operator!=(&local_40,&stack0xffffffffffffffb8);
    if (!bVar1) {
      element_type<std::vector<int,_std::allocator<int>_>_>::set(value,p);
      sVar2 = std::vector<int,_std::allocator<int>_>::size(c);
      dtype->num_elements = (int)sVar2;
      return true;
    }
    obj = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                    (&local_40);
    lVar3 = (long)i._M_current._4_4_;
    i._M_current._4_4_ = i._M_current._4_4_ + 1;
    bVar1 = parse<int>::make_value(obj,(adiak_value_t *)((long)p + lVar3 * 8),*dtype->subtype);
    if (!bVar1) break;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_40,0);
  }
  return false;
}

Assistant:

static bool make_value(T &c, adiak_value_t *value, adiak_datatype_t *dtype) {
            adiak_value_t *valarray = (adiak_value_t *) malloc(sizeof(adiak_value_t) * c.size());
            int j = 0;
            for (typename T::iterator i = c.begin(); i != c.end(); i++) {
               bool result = parse<typename T::value_type>::make_value(*i, valarray + j++, dtype->subtype[0]);               
               if (!result)
                  return false;
            }
            element_type<T>::set(*value, valarray);
            dtype->num_elements = c.size();
            return true;
         }